

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask16_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  long in_RAX;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
  auVar2 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + in_RAX));
  *(undefined1 (*) [32])out = auVar2;
  vpmovsxbd_avx2(ZEXT816(0x3c342c241c140c04));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + in_RAX));
  auVar3 = vpslld_avx2(auVar3,0x10);
  auVar2 = vpor_avx2(auVar3,auVar2);
  *(undefined1 (*) [32])out = auVar2;
  uVar1 = in[0x10];
  out[8] = uVar1;
  out[8] = in[0x11] << 0x10 | uVar1;
  uVar1 = in[0x12];
  out[9] = uVar1;
  out[9] = in[0x13] << 0x10 | uVar1;
  uVar1 = in[0x14];
  out[10] = uVar1;
  out[10] = in[0x15] << 0x10 | uVar1;
  uVar1 = in[0x16];
  out[0xb] = uVar1;
  out[0xb] = in[0x17] << 0x10 | uVar1;
  return out + 0xc;
}

Assistant:

uint32_t *__fastpackwithoutmask16_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;

  return out;
}